

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O2

gzip_status check_gzip_header(uchar *data,ssize_t len,ssize_t *headerlen)

{
  byte bVar1;
  byte bVar2;
  gzip_status gVar3;
  ssize_t totallen;
  ushort *puVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  gVar3 = GZIP_UNDERFLOW;
  if (len < 10) {
    return gVar3;
  }
  if (((*data != '\x1f') || (data[1] != 0x8b)) || (bVar1 = data[3], 0x1f < bVar1 || data[2] != '\b')
     ) {
    return GZIP_BAD;
  }
  uVar6 = len - 10;
  puVar4 = (ushort *)(data + 10);
  if ((bVar1 & 4) != 0) {
    if ((ulong)len < 0xc) {
      return gVar3;
    }
    uVar5 = (ulong)*puVar4 + 2;
    bVar7 = uVar6 < uVar5;
    uVar6 = uVar6 - uVar5;
    if (bVar7) {
      return gVar3;
    }
    puVar4 = (ushort *)((long)puVar4 + uVar5);
  }
  bVar2 = bVar1 & 8;
  while (bVar2 != 0) {
    bVar7 = uVar6 == 0;
    uVar6 = uVar6 - 1;
    if (bVar7) {
      return gVar3;
    }
    bVar2 = (byte)*puVar4;
    puVar4 = (ushort *)((long)puVar4 + 1);
  }
  if (0xf < bVar1) {
    uVar5 = 0;
    while( true ) {
      if (uVar6 == uVar5) {
        return gVar3;
      }
      if (*(char *)((long)puVar4 + uVar5) == '\0') break;
      uVar5 = uVar5 + 1;
    }
    uVar6 = uVar6 + ~uVar5;
  }
  if ((bVar1 & 2) != 0) {
    if ((long)uVar6 < 2) {
      return GZIP_UNDERFLOW;
    }
    uVar6 = uVar6 - 2;
  }
  *headerlen = len - uVar6;
  return GZIP_OK;
}

Assistant:

static gzip_status check_gzip_header(unsigned char const *data, ssize_t len,
                                     ssize_t *headerlen)
{
  int method, flags;
  const ssize_t totallen = len;

  /* The shortest header is 10 bytes */
  if(len < 10)
    return GZIP_UNDERFLOW;

  if((data[0] != GZIP_MAGIC_0) || (data[1] != GZIP_MAGIC_1))
    return GZIP_BAD;

  method = data[2];
  flags = data[3];

  if(method != Z_DEFLATED || (flags & RESERVED) != 0) {
    /* cannot handle this compression method or unknown flag */
    return GZIP_BAD;
  }

  /* Skip over time, xflags, OS code and all previous bytes */
  len -= 10;
  data += 10;

  if(flags & EXTRA_FIELD) {
    ssize_t extra_len;

    if(len < 2)
      return GZIP_UNDERFLOW;

    extra_len = (data[1] << 8) | data[0];

    if(len < (extra_len + 2))
      return GZIP_UNDERFLOW;

    len -= (extra_len + 2);
    data += (extra_len + 2);
  }

  if(flags & ORIG_NAME) {
    /* Skip over NUL-terminated filename */
    while(len && *data) {
      --len;
      ++data;
    }
    if(!len || *data)
      return GZIP_UNDERFLOW;

    /* Skip over the NUL */
    --len;
    ++data;
  }

  if(flags & COMMENT) {
    /* Skip over NUL-terminated comment */
    while(len && *data) {
      --len;
      ++data;
    }
    if(!len || *data)
      return GZIP_UNDERFLOW;

    /* Skip over the NUL */
    --len;
  }

  if(flags & HEAD_CRC) {
    if(len < 2)
      return GZIP_UNDERFLOW;

    len -= 2;
  }

  *headerlen = totallen - len;
  return GZIP_OK;
}